

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O1

int rsa_unblind(mbedtls_mpi *T,mbedtls_mpi *Vf,mbedtls_mpi *N)

{
  int iVar1;
  mbedtls_mpi_uint mm;
  ulong nblimbs;
  mbedtls_mpi M_T;
  mbedtls_mpi RR;
  
  mm = mbedtls_mpi_core_montmul_init(N->p);
  nblimbs = (ulong)N->n;
  mbedtls_mpi_init(&RR);
  mbedtls_mpi_init(&M_T);
  iVar1 = mbedtls_mpi_core_get_mont_r2_unsafe(&RR,N);
  if ((((iVar1 == 0) && (iVar1 = mbedtls_mpi_grow(&M_T,nblimbs * 2 + 1), iVar1 == 0)) &&
      (iVar1 = mbedtls_mpi_grow(T,nblimbs), iVar1 == 0)) &&
     (iVar1 = mbedtls_mpi_grow(Vf,nblimbs), iVar1 == 0)) {
    mbedtls_mpi_core_to_mont_rep(T->p,T->p,N->p,nblimbs,mm,RR.p,M_T.p);
    mbedtls_mpi_core_montmul(T->p,T->p,Vf->p,nblimbs,N->p,nblimbs,mm,M_T.p);
    iVar1 = 0;
  }
  mbedtls_mpi_free(&RR);
  mbedtls_mpi_free(&M_T);
  return iVar1;
}

Assistant:

static int rsa_unblind(mbedtls_mpi *T, mbedtls_mpi *Vf, const mbedtls_mpi *N)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const mbedtls_mpi_uint mm = mbedtls_mpi_core_montmul_init(N->p);
    const size_t nlimbs = N->n;
    const size_t tlimbs = mbedtls_mpi_core_montmul_working_limbs(nlimbs);
    mbedtls_mpi RR, M_T;

    mbedtls_mpi_init(&RR);
    mbedtls_mpi_init(&M_T);

    MBEDTLS_MPI_CHK(mbedtls_mpi_core_get_mont_r2_unsafe(&RR, N));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&M_T, tlimbs));

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(T, nlimbs));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(Vf, nlimbs));

    /* T = T * Vf mod N
     * Reminder: montmul(A, B, N) = A * B * R^-1 mod N
     * Usually both operands are multiplied by R mod N beforehand (by calling
     * `to_mont_rep()` on them), yielding a result that's also * R mod N (aka
     * "in the Montgomery domain"). Here we only multiply one operand by R mod
     * N, so the result is directly what we want - no need to call
     * `from_mont_rep()` on it. */
    mbedtls_mpi_core_to_mont_rep(T->p, T->p, N->p, nlimbs, mm, RR.p, M_T.p);
    mbedtls_mpi_core_montmul(T->p, T->p, Vf->p, nlimbs, N->p, nlimbs, mm, M_T.p);

cleanup:

    mbedtls_mpi_free(&RR);
    mbedtls_mpi_free(&M_T);

    return ret;
}